

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load_runtime_symtab_from_macr(CVmImageLoader *this,ulong siz)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  size_t in_RSI;
  char *in_RDI;
  size_t l_1;
  vm_runtime_sym *entry;
  size_t l;
  size_t arg_len;
  ulong start_siz;
  long start_pos;
  int i;
  uint flags;
  int argc;
  size_t exp_len;
  size_t sym_len;
  ulong cnt;
  char sym [80];
  char buf [10];
  size_t TOK_SYM_MAX_LEN;
  ulong *in_stack_ffffffffffffff08;
  ulong *remaining_size;
  CVmRuntimeSymbols *in_stack_ffffffffffffff10;
  CVmImageLoader *in_stack_ffffffffffffff20;
  vm_runtime_sym *in_stack_ffffffffffffff28;
  CVmRuntimeSymbols *in_stack_ffffffffffffff30;
  ulong *local_c8;
  size_t arglen;
  int local_ac;
  ulong local_80;
  undefined1 local_22 [2];
  undefined1 auStack_20 [8];
  undefined8 local_18;
  size_t local_10;
  
  local_18 = 0x50;
  local_c8 = in_stack_ffffffffffffff08;
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x68) == 0) {
    in_stack_ffffffffffffff10 = (CVmRuntimeSymbols *)operator_new(0x18);
    CVmRuntimeSymbols::CVmRuntimeSymbols(in_stack_ffffffffffffff10);
    *(CVmRuntimeSymbols **)(in_RDI + 0x68) = in_stack_ffffffffffffff10;
    local_c8 = in_stack_ffffffffffffff08;
  }
  read_data(in_stack_ffffffffffffff20,in_RDI,(size_t)in_stack_ffffffffffffff10,local_c8);
  uVar4 = ::osrp4(local_22);
  for (local_80 = uVar4 & 0xffffffff; local_80 != 0; local_80 = local_80 - 1) {
    read_data(in_stack_ffffffffffffff20,in_RDI,(size_t)in_stack_ffffffffffffff10,local_c8);
    uVar1 = ::osrp2(local_22);
    if (uVar1 < 0x51) {
      read_data(in_stack_ffffffffffffff20,in_RDI,(size_t)in_stack_ffffffffffffff10,local_c8);
      remaining_size = local_c8;
    }
    else {
      skip_data(in_stack_ffffffffffffff20,(size_t)in_RDI,(ulong *)in_stack_ffffffffffffff10);
      remaining_size = local_c8;
    }
    read_data(in_stack_ffffffffffffff20,in_RDI,(size_t)in_stack_ffffffffffffff10,remaining_size);
    ::osrp2(local_22);
    iVar2 = ::osrp2(auStack_20);
    uVar5 = (**(code **)(**(long **)in_RDI + 0x40))();
    local_c8 = (ulong *)0x0;
    arglen = local_10;
    for (local_ac = 0; local_ac < iVar2; local_ac = local_ac + 1) {
      read_data(in_stack_ffffffffffffff20,in_RDI,(size_t)in_stack_ffffffffffffff10,remaining_size);
      iVar3 = ::osrp2(local_22);
      in_stack_ffffffffffffff30 = (CVmRuntimeSymbols *)(long)iVar3;
      local_c8 = (ulong *)((undefined1 *)((long)&in_stack_ffffffffffffff30->head_ + 1) +
                          (long)local_c8);
      skip_data(in_stack_ffffffffffffff20,(size_t)in_RDI,(ulong *)in_stack_ffffffffffffff10);
    }
    read_data(in_stack_ffffffffffffff20,in_RDI,(size_t)in_stack_ffffffffffffff10,remaining_size);
    ::osrp4(local_22);
    in_stack_ffffffffffffff28 =
         CVmRuntimeSymbols::add_macro
                   (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                    (size_t)in_stack_ffffffffffffff20,(size_t)in_RDI,
                    (uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),(int)in_stack_ffffffffffffff10,
                    arglen);
    (**(code **)(**(long **)in_RDI + 0x38))(*(long **)in_RDI,uVar5);
    local_10 = arglen;
    for (local_ac = 0; local_ac < iVar2; local_ac = local_ac + 1) {
      read_data(in_stack_ffffffffffffff20,in_RDI,(size_t)in_stack_ffffffffffffff10,local_c8);
      iVar3 = ::osrp2(local_22);
      in_stack_ffffffffffffff20 = (CVmImageLoader *)(long)iVar3;
      read_data(in_stack_ffffffffffffff20,in_RDI,(size_t)in_stack_ffffffffffffff10,local_c8);
      in_stack_ffffffffffffff28->macro_args[local_ac][(long)in_stack_ffffffffffffff20] = '\0';
      vm_runtime_sym::commit_macro_arg
                (in_stack_ffffffffffffff28,local_ac,
                 (size_t)((long)&in_stack_ffffffffffffff20->fp_ + 1));
    }
    skip_data(in_stack_ffffffffffffff20,(size_t)in_RDI,(ulong *)in_stack_ffffffffffffff10);
    read_data(in_stack_ffffffffffffff20,in_RDI,(size_t)in_stack_ffffffffffffff10,local_c8);
  }
  return;
}

Assistant:

void CVmImageLoader::load_runtime_symtab_from_macr(VMG_ ulong siz)
{
    const size_t TOK_SYM_MAX_LEN = 80;
    char buf[10];
    char sym[TOK_SYM_MAX_LEN];
    ulong cnt;

    /* allocate the macro table if we haven't already done so */
    if (runtime_macros_ == 0)
        runtime_macros_ = new CVmRuntimeSymbols();

    /* read the symbol count */
    read_data(buf, 4, &siz);
    cnt = t3rp4u(buf);

    /* read the symbols and populate the symbol table */
    for ( ; cnt != 0 ; --cnt)
    {
        size_t sym_len;
        size_t exp_len;
        int argc;
        unsigned int flags;
        int i;

        /* read the symbol's length */
        read_data(buf, 2, &siz);
        sym_len = osrp2(buf);

        /* if it fits, read it */
        if (sym_len <= TOK_SYM_MAX_LEN)
        {
            /* read the name */
            read_data(sym, sym_len, &siz);
        }
        else
        {
            /* it's too long - skip it */
            skip_data(sym_len, &siz);
        }

        /* read the flags and argument count */
        read_data(buf, 4, &siz);
        flags = osrp2(buf);
        argc = osrp2(buf + 2);

        /* remember the current position */
        long start_pos = fp_->get_seek();
        ulong start_siz = siz;

        /* count up the argument sizes */
        size_t arg_len = 0;
        for (i = 0 ; i < argc ; ++i)
        {
            /* read this argument length */
            read_data(buf, 2, &siz);
            size_t l = osrp2(buf);

            /* add it to the total, plus a null byte */
            arg_len += l + 1;

            /* skip it in the file */
            skip_data(l, &siz);
        }

        /* read the expansion size */
        read_data(buf, 4, &siz);
        exp_len = osrp4(buf);

        /* allocate the symbol entry */
        vm_runtime_sym *entry = runtime_macros_->add_macro(
            sym, sym_len, exp_len, flags, argc, arg_len);

        /* seek back to the start of the argument list */
        fp_->seek(start_pos);
        siz = start_siz;

        /* read the arguments */
        for (i = 0 ; i < argc ; ++i)
        {
            /* read the argument length */
            read_data(buf, 2, &siz);
            size_t l = osrp2(buf);

            /* read this argument, and null-terminate it */
            read_data(entry->macro_args[i], l, &siz);
            entry->macro_args[i][l] = '\0';

            /* commit the storage */
            entry->commit_macro_arg(i, l + 1);
        }

        /* read the expansion */
        skip_data(4, &siz);
        read_data(entry->macro_expansion, exp_len, &siz);
    }
}